

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  QDebug *pQVar1;
  QCoreApplication a;
  ExampleConfig example;
  QArrayDataPointer<char16_t> local_c0;
  QDebug local_a8;
  int local_9c [9];
  QCoreApplication local_78 [16];
  ExampleConfig local_68;
  
  local_9c[0] = argc;
  QCoreApplication::QCoreApplication(local_78,local_9c,argv,0x60204);
  QString::QString((QString *)&local_68,"Example config app");
  QCoreApplication::setApplicationName((QString *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  QString::QString((QString *)&local_68,"Milo");
  QCoreApplication::setOrganizationName((QString *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  ExampleConfig::ExampleConfig(&local_68);
  coreMain();
  if ((coreMain()::category[0x10] & 1) != 0) {
    coreMain();
    local_9c[1] = 2;
    local_9c[2] = 0;
    local_9c[3] = 0;
    local_9c[4] = 0;
    local_9c[5] = 0;
    local_9c[6] = 0;
    local_9c[7] = coreMain()::category._8_4_;
    local_9c[8] = coreMain()::category._12_4_;
    QMessageLogger::debug();
    pQVar1 = QDebug::operator<<(&local_a8,"Application name is:");
    QCoreApplication::applicationName();
    QDebug::operator<<(pQVar1,(QString *)&local_c0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
    QDebug::~QDebug(&local_a8);
  }
  coreMain();
  if ((coreMain()::category[0x10] & 1) != 0) {
    coreMain();
    local_9c[1] = 2;
    local_9c[2] = 0;
    local_9c[3] = 0;
    local_9c[4] = 0;
    local_9c[5] = 0;
    local_9c[6] = 0;
    local_9c[7] = coreMain()::category._8_4_;
    local_9c[8] = coreMain()::category._12_4_;
    QMessageLogger::debug();
    pQVar1 = QDebug::operator<<((QDebug *)&local_c0,"Example value is:");
    QDebug::operator<<(pQVar1,local_68.exampleValue);
    QDebug::~QDebug((QDebug *)&local_c0);
  }
  coreMain();
  if ((coreMain()::category[0x10] & 1) != 0) {
    coreMain();
    local_9c[1] = 2;
    local_9c[2] = 0;
    local_9c[3] = 0;
    local_9c[4] = 0;
    local_9c[5] = 0;
    local_9c[6] = 0;
    local_9c[7] = coreMain()::category._8_4_;
    local_9c[8] = coreMain()::category._12_4_;
    QMessageLogger::debug();
    pQVar1 = QDebug::operator<<((QDebug *)&local_c0,"Example string is:");
    QDebug::operator<<(pQVar1,&local_68.exampleString);
    QDebug::~QDebug((QDebug *)&local_c0);
  }
  coreMain();
  if ((coreMain()::category[0x10] & 1) != 0) {
    coreMain();
    local_9c[1] = 2;
    local_9c[2] = 0;
    local_9c[3] = 0;
    local_9c[4] = 0;
    local_9c[5] = 0;
    local_9c[6] = 0;
    local_9c[7] = coreMain()::category._8_4_;
    local_9c[8] = coreMain()::category._12_4_;
    QMessageLogger::debug();
    pQVar1 = QDebug::operator<<(&local_a8,"Config file would be saved to:");
    MBaseConfig::filePath((QString *)&local_c0,(MBaseConfig *)&local_68);
    QDebug::operator<<(pQVar1,(QString *)&local_c0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
    QDebug::~QDebug(&local_a8);
  }
  coreMain();
  if ((coreMain()::category[0x10] & 1) != 0) {
    coreMain();
    local_9c[1] = 2;
    local_9c[2] = 0;
    local_9c[3] = 0;
    local_9c[4] = 0;
    local_9c[5] = 0;
    local_9c[6] = 0;
    local_9c[7] = coreMain()::category._8_4_;
    local_9c[8] = coreMain()::category._12_4_;
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)&local_c0,
                       "Uncomment load and save in ExampleConfig class if you actually want to create and use config file. "
                      );
    QDebug::~QDebug((QDebug *)&local_c0);
  }
  coreMain();
  if ((coreMain()::category[0x10] & 1) != 0) {
    coreMain();
    local_9c[1] = 2;
    local_9c[2] = 0;
    local_9c[3] = 0;
    local_9c[4] = 0;
    local_9c[5] = 0;
    local_9c[6] = 0;
    local_9c[7] = coreMain()::category._8_4_;
    local_9c[8] = coreMain()::category._12_4_;
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)&local_c0,
                       "If you want to encrypt your config add mcrypto to the project and enable build option: mconfig-crypto"
                      );
    QDebug::~QDebug((QDebug *)&local_c0);
  }
  ExampleConfig::~ExampleConfig(&local_68);
  QCoreApplication::~QCoreApplication(local_78);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    QCoreApplication a(argc, argv);
    a.setApplicationName("Example config app");
    a.setOrganizationName("Milo");

    ExampleConfig example;
    qCDebug(coreMain) << "Application name is:" << a.applicationName();
    qCDebug(coreMain) << "Example value is:" << example.exampleValue;
    qCDebug(coreMain) << "Example string is:" << example.exampleString;
    qCDebug(coreMain) << "Config file would be saved to:" << example.filePath();
    qCDebug(coreMain) << "Uncomment load and save in ExampleConfig class if you actually want to create and use config file. ";
    qCDebug(coreMain) << "If you want to encrypt your config add mcrypto to the project and enable build option: mconfig-crypto";

    return 0;
}